

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::MakeCurrentPerfCase::MakeCurrentPerfCase
          (MakeCurrentPerfCase *this,EglTestContext *eglTestCtx,Spec *spec,char *name,
          char *description)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined3 uVar4;
  deUint32 seed;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MakeCurrentPerfCase_003e8480;
  iVar1 = spec->contextCount;
  iVar2 = spec->surfaceCount;
  bVar3 = spec->release;
  uVar4 = *(undefined3 *)&spec->field_0xd;
  (this->m_spec).surfaceTypes = spec->surfaceTypes;
  (this->m_spec).contextCount = iVar1;
  (this->m_spec).surfaceCount = iVar2;
  (this->m_spec).release = bVar3;
  *(undefined3 *)&(this->m_spec).field_0xd = uVar4;
  iVar1 = spec->sampleCount;
  (this->m_spec).iterationCount = spec->iterationCount;
  (this->m_spec).sampleCount = iVar1;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  memset(&this->m_display,0,0x88);
  return;
}

Assistant:

MakeCurrentPerfCase::MakeCurrentPerfCase (EglTestContext& eglTestCtx, const Spec& spec, const char* name, const char* description)
	: TestCase		(eglTestCtx, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_spec		(spec)
	, m_rnd			(deStringHash(name))
	, m_display		(EGL_NO_DISPLAY)
	, m_config		(DE_NULL)
{
}